

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  uint uVar1;
  VarData *pVVar2;
  uint64_t uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  uint *puVar10;
  int iVar11;
  lbool *plVar12;
  ulong uVar13;
  vec<Minisat::Watcher> *pvVar14;
  long lVar15;
  ulong uVar16;
  
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (&this->watches);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
            (&this->watches_bin);
  if (0 < (this->vardata).sz) {
    lVar7 = 0;
    do {
      uVar16 = 0;
      bVar4 = true;
      do {
        bVar5 = bVar4;
        uVar16 = uVar16 | lVar7 * 2;
        pvVar14 = (this->watches).occs.data;
        if (0 < pvVar14[uVar16].sz) {
          pvVar14 = pvVar14 + uVar16;
          lVar15 = 0;
          lVar9 = 0;
          do {
            ClauseAllocator::reloc(&this->ca,(CRef *)((long)&pvVar14->data->cref + lVar15),to);
            lVar9 = lVar9 + 1;
            lVar15 = lVar15 + 8;
          } while (lVar9 < pvVar14->sz);
        }
        pvVar14 = (this->watches_bin).occs.data;
        if (0 < pvVar14[uVar16].sz) {
          pvVar14 = pvVar14 + uVar16;
          lVar9 = 0;
          lVar15 = 0;
          do {
            ClauseAllocator::reloc(&this->ca,(CRef *)((long)&pvVar14->data->cref + lVar9),to);
            lVar15 = lVar15 + 1;
            lVar9 = lVar9 + 8;
          } while (lVar15 < pvVar14->sz);
        }
        uVar16 = 1;
        bVar4 = false;
      } while (bVar5);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->vardata).sz);
  }
  iVar6 = (this->trail).sz;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      pVVar2 = (this->vardata).data;
      iVar8 = (this->trail).data[lVar7].x >> 1;
      uVar1 = pVVar2[iVar8].reason;
      uVar16 = (ulong)uVar1;
      if ((uVar16 != 0xffffffff) &&
         (uVar3 = (this->statistics).solveSteps, (this->statistics).solveSteps = uVar3 + 1,
         uVar3 != 0)) {
        puVar10 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        if ((*(ulong *)(puVar10 + uVar16) & 0x10) == 0) {
          if ((uint)(*(ulong *)(puVar10 + uVar16) >> 0x22) == 2) {
            plVar12 = (this->assigns).data;
            uVar13 = (ulong)(plVar12[(int)puVar10[uVar16 + 2] >> 1].value !=
                            ((byte)puVar10[uVar16 + 2] & 1));
          }
          else {
            plVar12 = (this->assigns).data;
            uVar13 = 0;
          }
          iVar11 = (int)puVar10[uVar16 + uVar13 + 2] >> 1;
          if (((plVar12[iVar11].value != ((byte)puVar10[uVar16 + uVar13 + 2] & 1)) ||
              (pVVar2[iVar11].reason == 0xffffffff)) || (pVVar2[iVar11].reason != uVar1))
          goto LAB_0011c0d3;
        }
        ClauseAllocator::reloc(&this->ca,&pVVar2[iVar8].reason,to);
        iVar6 = (this->trail).sz;
      }
LAB_0011c0d3:
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6);
  }
  iVar6 = (this->old_trail).sz;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      puVar10 = (this->oldreasons).data;
      iVar8 = (this->old_trail).data[lVar7].x >> 1;
      uVar16 = (ulong)puVar10[iVar8];
      if ((uVar16 != 0xffffffff) &&
         (((this->ca).super_RegionAllocator<unsigned_int>.memory[uVar16] & 0x10) != 0)) {
        ClauseAllocator::reloc(&this->ca,puVar10 + iVar8,to);
        iVar6 = (this->old_trail).sz;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6);
  }
  if (0 < (this->learnts_core).sz) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->learnts_core).data + lVar9),to);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 4;
    } while (lVar7 < (this->learnts_core).sz);
  }
  if (0 < (this->learnts_tier2).sz) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->learnts_tier2).data + lVar9),to);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 4;
    } while (lVar7 < (this->learnts_tier2).sz);
  }
  if (0 < (this->learnts_local).sz) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->learnts_local).data + lVar9),to);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 4;
    } while (lVar7 < (this->learnts_local).sz);
  }
  iVar6 = (this->clauses).sz;
  if (0 < iVar6) {
    puVar10 = (this->clauses).data;
    lVar7 = 0;
    lVar9 = 0;
    iVar8 = 0;
    do {
      if (((this->ca).super_RegionAllocator<unsigned_int>.memory[*(uint *)((long)puVar10 + lVar7)] &
          3) != 1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar10 + lVar7),to);
        puVar10 = (this->clauses).data;
        lVar15 = (long)iVar8;
        iVar8 = iVar8 + 1;
        puVar10[lVar15] = *(uint *)((long)puVar10 + lVar7);
        iVar6 = (this->clauses).sz;
      }
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 4;
    } while (lVar9 < iVar6);
    if (0 < (int)lVar9 - iVar8) {
      (this->clauses).sz = (iVar6 + iVar8) - (int)lVar9;
    }
  }
  iVar6 = (this->simplifyBuffer).ring.sz;
  if (0 < iVar6) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      puVar10 = (this->simplifyBuffer).ring.data;
      if (*(int *)((long)puVar10 + lVar9) != -1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar10 + lVar9),to);
        iVar6 = (this->simplifyBuffer).ring.sz;
      }
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 4;
    } while (lVar7 < iVar6);
  }
  return;
}

Assistant:

void Solver::relocAll(ClauseAllocator &to)
{
    TRACE(std::cout << "c relocing ..." << std::endl);

    // All watchers:
    //
    // for (int i = 0; i < watches.size(); i++)
    watches.cleanAll();
    watches_bin.cleanAll();
    for (int v = 0; v < nVars(); v++)
        for (int s = 0; s < 2; s++) {
            Lit p = mkLit(v, s);
            // printf(" >>> RELOCING: %s%d\n", sign(p)?"-":"", var(p)+1);
            vec<Watcher> &ws = watches[p];
            for (int j = 0; j < ws.size(); j++) ca.reloc(ws[j].cref, to);
            vec<Watcher> &ws_bin = watches_bin[p];
            for (int j = 0; j < ws_bin.size(); j++) ca.reloc(ws_bin[j].cref, to);
        }

    // All reasons:
    //
    for (int i = 0; i < trail.size(); i++) {
        Var v = var(trail[i]);

        // Note: it is not safe to call 'locked()' on a relocated clause. This is why we keep
        // 'dangling' reasons here. It is safe and does not hurt.
        if (reason(v) != CRef_Undef && statistics.solveSteps++ && (ca[reason(v)].reloced() || locked(ca[reason(v)])))
            ca.reloc(vardata[v].reason, to);
    }

    for (int i = 0; i < old_trail.size(); i++) {
        Var v = var(old_trail[i]);

        if (oldreasons[v] != CRef_Undef && (ca[oldreasons[v]].reloced())) ca.reloc(oldreasons[v], to);
    }

    // All learnt:
    //
    for (int i = 0; i < learnts_core.size(); i++) ca.reloc(learnts_core[i], to);
    for (int i = 0; i < learnts_tier2.size(); i++) ca.reloc(learnts_tier2[i], to);
    for (int i = 0; i < learnts_local.size(); i++) ca.reloc(learnts_local[i], to);

    // All original:
    //
    int i, j;
    for (i = j = 0; i < clauses.size(); i++)
        if (ca[clauses[i]].mark() != 1) {
            ca.reloc(clauses[i], to);
            clauses[j++] = clauses[i];
        }
    clauses.shrink(i - j);

    for (int i = 0; i < simplifyBuffer.size(); i++) {
        if (simplifyBuffer[i] != CRef_Undef) ca.reloc(simplifyBuffer[i], to);
    }
}